

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O3

void Omega_h::find_matches_ex<long>
               (Int deg,LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *this;
  Read<int> local_148;
  Read<int> local_138;
  LOs local_128;
  Read<int> local_118;
  Read<int> local_108;
  LOs local_f8;
  Read<int> local_e8;
  Read<int> local_d8;
  LOs local_c8;
  Adj local_b8;
  Adj local_88;
  Adj local_58;
  
  if (deg == 4) {
    local_128.write_.shared_alloc_.alloc = (a2fv->write_).shared_alloc_.alloc;
    if (((ulong)local_128.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.write_.shared_alloc_.alloc =
             (Alloc *)((local_128.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.write_.shared_alloc_.alloc)->use_count =
             (local_128.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.write_.shared_alloc_.direct_ptr = (a2fv->write_).shared_alloc_.direct_ptr;
    local_138.write_.shared_alloc_.alloc = (av2v->write_).shared_alloc_.alloc;
    if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
        local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_138.write_.shared_alloc_.alloc =
             (Alloc *)((local_138.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_138.write_.shared_alloc_.alloc)->use_count =
             (local_138.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_138.write_.shared_alloc_.direct_ptr = (av2v->write_).shared_alloc_.direct_ptr;
    local_148.write_.shared_alloc_.alloc = (bv2v->write_).shared_alloc_.alloc;
    if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148.write_.shared_alloc_.alloc =
             (Alloc *)((local_148.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_148.write_.shared_alloc_.alloc)->use_count =
             (local_148.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_148.write_.shared_alloc_.direct_ptr = (bv2v->write_).shared_alloc_.direct_ptr;
    local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_b8.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_b8.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_b8.codes.write_.shared_alloc_.alloc = (v2b->codes).write_.shared_alloc_.alloc;
    if (((ulong)local_b8.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.codes.write_.shared_alloc_.alloc)->use_count =
             (local_b8.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.codes.write_.shared_alloc_.direct_ptr = (v2b->codes).write_.shared_alloc_.direct_ptr;
    find_matches_deg<4,long>
              (&local_128,&local_138,&local_148,&local_b8,a2b_out,codes_out,allow_duplicates);
    Adj::~Adj(&local_b8);
    pAVar2 = local_148.write_.shared_alloc_.alloc;
    if (((ulong)local_148.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_148.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_148.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_138.write_.shared_alloc_.alloc;
    this = local_128.write_.shared_alloc_.alloc;
    if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
        local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_138.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        this = local_128.write_.shared_alloc_.alloc;
      }
    }
  }
  else if (deg == 3) {
    local_f8.write_.shared_alloc_.alloc = (a2fv->write_).shared_alloc_.alloc;
    if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_f8.write_.shared_alloc_.alloc =
             (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_f8.write_.shared_alloc_.alloc)->use_count =
             (local_f8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_f8.write_.shared_alloc_.direct_ptr = (a2fv->write_).shared_alloc_.direct_ptr;
    local_108.write_.shared_alloc_.alloc = (av2v->write_).shared_alloc_.alloc;
    if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
        local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_108.write_.shared_alloc_.alloc =
             (Alloc *)((local_108.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_108.write_.shared_alloc_.alloc)->use_count =
             (local_108.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_108.write_.shared_alloc_.direct_ptr = (av2v->write_).shared_alloc_.direct_ptr;
    local_118.write_.shared_alloc_.alloc = (bv2v->write_).shared_alloc_.alloc;
    if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_118.write_.shared_alloc_.alloc =
             (Alloc *)((local_118.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_118.write_.shared_alloc_.alloc)->use_count =
             (local_118.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_118.write_.shared_alloc_.direct_ptr = (bv2v->write_).shared_alloc_.direct_ptr;
    local_88.super_Graph.a2ab.write_.shared_alloc_.alloc =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_88.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.super_Graph.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_88.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_88.super_Graph.ab2b.write_.shared_alloc_.alloc =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_88.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_88.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_88.codes.write_.shared_alloc_.alloc = (v2b->codes).write_.shared_alloc_.alloc;
    if (((ulong)local_88.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_88.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_88.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_88.codes.write_.shared_alloc_.alloc)->use_count =
             (local_88.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.codes.write_.shared_alloc_.direct_ptr = (v2b->codes).write_.shared_alloc_.direct_ptr;
    find_matches_deg<3,long>
              (&local_f8,&local_108,&local_118,&local_88,a2b_out,codes_out,allow_duplicates);
    Adj::~Adj(&local_88);
    pAVar2 = local_118.write_.shared_alloc_.alloc;
    if (((ulong)local_118.write_.shared_alloc_.alloc & 7) == 0 &&
        local_118.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_118.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_118.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_108.write_.shared_alloc_.alloc;
    this = local_f8.write_.shared_alloc_.alloc;
    if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
        local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        this = local_f8.write_.shared_alloc_.alloc;
      }
    }
  }
  else {
    if (deg != 2) {
      fail("find_matches_ex called with unsupported degree %d\n",(ulong)(uint)deg);
    }
    local_c8.write_.shared_alloc_.alloc = (a2fv->write_).shared_alloc_.alloc;
    if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8.write_.shared_alloc_.alloc =
             (Alloc *)((local_c8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_c8.write_.shared_alloc_.alloc)->use_count =
             (local_c8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_c8.write_.shared_alloc_.direct_ptr = (a2fv->write_).shared_alloc_.direct_ptr;
    local_d8.write_.shared_alloc_.alloc = (av2v->write_).shared_alloc_.alloc;
    if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d8.write_.shared_alloc_.alloc =
             (Alloc *)((local_d8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d8.write_.shared_alloc_.alloc)->use_count =
             (local_d8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_d8.write_.shared_alloc_.direct_ptr = (av2v->write_).shared_alloc_.direct_ptr;
    local_e8.write_.shared_alloc_.alloc = (bv2v->write_).shared_alloc_.alloc;
    if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_e8.write_.shared_alloc_.alloc =
             (Alloc *)((local_e8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_e8.write_.shared_alloc_.alloc)->use_count =
             (local_e8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_e8.write_.shared_alloc_.direct_ptr = (bv2v->write_).shared_alloc_.direct_ptr;
    local_58.super_Graph.a2ab.write_.shared_alloc_.alloc =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_58.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.super_Graph.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_58.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    local_58.super_Graph.ab2b.write_.shared_alloc_.alloc =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_58.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_58.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         (v2b->super_Graph).ab2b.write_.shared_alloc_.direct_ptr;
    local_58.codes.write_.shared_alloc_.alloc = (v2b->codes).write_.shared_alloc_.alloc;
    if (((ulong)local_58.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.codes.write_.shared_alloc_.alloc)->use_count =
             (local_58.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_58.codes.write_.shared_alloc_.direct_ptr = (v2b->codes).write_.shared_alloc_.direct_ptr;
    find_matches_deg<2,long>
              (&local_c8,&local_d8,&local_e8,&local_58,a2b_out,codes_out,allow_duplicates);
    Adj::~Adj(&local_58);
    pAVar2 = local_e8.write_.shared_alloc_.alloc;
    if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_d8.write_.shared_alloc_.alloc;
    this = local_c8.write_.shared_alloc_.alloc;
    if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        this = local_c8.write_.shared_alloc_.alloc;
      }
    }
  }
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  return;
}

Assistant:

void find_matches_ex(Int const deg, LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  if (deg == 2) {
    find_matches_deg<2>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else if (deg == 3) {
    find_matches_deg<3>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else if (deg == 4) {
    find_matches_deg<4>(
        a2fv, av2v, bv2v, v2b, a2b_out, codes_out, allow_duplicates);
  } else {
    Omega_h_fail("find_matches_ex called with unsupported degree %d\n", deg);
  }
}